

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

boolean artifact_hit(monst *magr,monst *mdef,obj *otmp,obj *ostack,boolean thrown,int *dmgptr,
                    int dieroll)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  boolean bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  obj **ppoVar11;
  char *pcVar12;
  char *pcVar13;
  artifact *paVar14;
  int *piVar15;
  bool bVar16;
  monst *mtmp;
  undefined8 uVar17;
  obj *olaunch;
  byte bVar18;
  bool bVar19;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  char hittee_1 [256];
  char hittee [256];
  char wepbuf [256];
  char *local_470;
  char *local_468;
  char local_438 [256];
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  bVar22 = magr == &youmonst;
  if ((bVar22 == (magr != (monst *)0x0)) ||
     (bVar16 = true, (viz_array[magr->my][magr->mx] & 2U) == 0)) {
    if (mdef == &youmonst) {
      if (magr == &youmonst) goto LAB_0014d432;
LAB_0014d472:
      bVar16 = false;
    }
    else {
      bVar16 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
      if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) {
LAB_0014d432:
        bVar16 = false;
        if ((((u._1052_1_ & 1) != 0) && (u.ustuck == mdef)) &&
           ((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (bVar16 = true, ((youmonst.data)->mflags1 & 0x1000) != 0)))))) {
          if (ublindf == (obj *)0x0) goto LAB_0014d472;
          bVar16 = ublindf->oartifact == '\x1d';
        }
      }
    }
  }
  if (thrown == '\0') {
LAB_0014d4f8:
    olaunch = (obj *)0x0;
  }
  else {
    if (magr == &youmonst) {
      ppoVar11 = &uwep;
LAB_0014d498:
      olaunch = *ppoVar11;
    }
    else {
      if (magr != (monst *)0x0) {
        ppoVar11 = &magr->mw;
        goto LAB_0014d498;
      }
      olaunch = (obj *)0x0;
    }
    if ((((olaunch == (obj *)0x0) || (olaunch->oclass != '\x02')) ||
        ((2 < (byte)(objects[olaunch->otyp].oc_subtyp - 0x16U) ||
         ((otmp->oclass != '\r' && (otmp->oclass != '\x02')))))) ||
       ((2 < (byte)(objects[otmp->otyp].oc_subtyp + 0x18U) ||
        ((int)objects[otmp->otyp].oc_subtyp != -(uint)(byte)objects[olaunch->otyp].oc_subtyp))))
    goto LAB_0014d4f8;
  }
  if ((otmp->oartifact == '\0') && (bVar6 = oprop_attack(0xf,otmp,olaunch,thrown), bVar6 == '\0')) {
    return '\0';
  }
  pcVar20 = "The";
  if (magr == &youmonst) {
    pcVar20 = "Your";
  }
  pcVar12 = distant_name(otmp,xname);
  local_468 = local_238;
  snprintf(local_468,0x100,"%s %s",pcVar20,pcVar12);
  if (mdef == &youmonst) {
    pcVar12 = "you";
  }
  else {
    pcVar12 = mon_nam(mdef);
  }
  strcpy(local_338,pcVar12);
  iVar7 = spec_dbon(otmp,olaunch,thrown,mdef,*dmgptr);
  *dmgptr = *dmgptr + iVar7;
  if (magr == &youmonst && mdef == &youmonst) {
    warning("attacking yourself with weapon?");
    return '\0';
  }
  bVar23 = mdef == &youmonst;
  bVar3 = u.ustuck == mdef;
  bVar4 = magr == &youmonst;
  bVar18 = (bVar3 && bVar4) | bVar23 | bVar16;
  bVar6 = attacks(2,otmp,olaunch,thrown);
  if (bVar6 == '\0') {
    bVar24 = false;
  }
  else {
    local_468 = local_238;
    if ((bVar3 && bVar4 || (bVar23 || bVar16 != false)) &&
       (otmp->oartifact != '\0' || spec_applies_ad_fire != '\0')) {
      if (otmp->oartifact == '\f') {
        local_468 = "The fiery blade";
      }
      if (spec_applies_ad_fire == '\0') {
        pcVar12 = "hits";
        uVar17 = 0x2e;
      }
      else {
        pcVar12 = "burns";
        if (mdef->data == mons + 0xa2) {
          pcVar12 = "vaporizes part of";
        }
        uVar17 = 0x21;
      }
      pline("%s %s %s%c",local_468,pcVar12,local_338,uVar17);
      bVar24 = true;
      if (spec_applies_ad_fire != '\0') {
        oprop_id(1,otmp,ostack,olaunch);
      }
    }
    else {
      bVar24 = false;
    }
    uVar8 = mt_random();
    if (((uVar8 & 3) == 0) &&
       (bVar6 = destroy_mitem(mdef,8,2,dmgptr), (bVar6 != '\0' & bVar18) == 1)) {
      oprop_id(1,otmp,ostack,olaunch);
    }
    uVar8 = mt_random();
    if (((uVar8 & 3) == 0) &&
       (bVar6 = destroy_mitem(mdef,9,2,dmgptr), (bVar6 != '\0' & bVar18) == 1)) {
      oprop_id(1,otmp,ostack,olaunch);
    }
    uVar8 = mt_random();
    if ((uVar8 * -0x49249249 < 0x24924925) &&
       (bVar6 = destroy_mitem(mdef,10,2,dmgptr), (bVar6 != '\0' & bVar18) == 1)) {
      oprop_id(1,otmp,ostack,olaunch);
    }
    if ((mdef == &youmonst) && (u.uprops[0x3a].intrinsic != 0)) {
      burn_away_slime();
      oprop_id(1,otmp,ostack,olaunch);
    }
  }
  bVar6 = attacks(3,otmp,olaunch,thrown);
  if (bVar6 != '\0') {
    if ((bVar3 && bVar4 || (bVar23 || bVar16 != false)) &&
       (otmp->oartifact != '\0' || spec_applies_ad_cold != '\0')) {
      if (otmp->oartifact == '\v') {
        local_468 = "The ice-cold blade";
      }
      pcVar12 = "freezes";
      if (spec_applies_ad_cold == '\0') {
        pcVar12 = "hits";
      }
      uVar17 = 0x21;
      if (spec_applies_ad_cold == '\0') {
        uVar17 = 0x2e;
      }
      pline("%s %s %s%c",local_468,pcVar12,local_338,uVar17);
      bVar24 = true;
      if (spec_applies_ad_cold != '\0') {
        oprop_id(2,otmp,ostack,olaunch);
      }
    }
    uVar8 = mt_random();
    if (((uVar8 & 3) == 0) &&
       (bVar6 = destroy_mitem(mdef,8,3,dmgptr), (bVar6 != '\0' & bVar18) == 1)) {
      oprop_id(2,otmp,ostack,olaunch);
    }
  }
  bVar6 = attacks(6,otmp,olaunch,thrown);
  if (bVar6 != '\0') {
    if ((bVar3 && bVar4 || (bVar23 || bVar16 != false)) &&
       (otmp->oartifact != '\0' || spec_applies_ad_elec != '\0')) {
      pcVar12 = "!  Lightning strikes";
      if (spec_applies_ad_elec == '\0') {
        pcVar12 = "";
      }
      uVar17 = 0x21;
      if (spec_applies_ad_elec == '\0') {
        uVar17 = 0x2e;
      }
      pline("The massive hammer hits%s %s%c",pcVar12,local_338,uVar17);
      bVar24 = true;
    }
    uVar8 = mt_random();
    if (uVar8 * -0x33333333 < 0x33333334) {
      destroy_mitem(mdef,0xb,6,dmgptr);
    }
  }
  bVar6 = attacks(1,otmp,olaunch,thrown);
  if (((bVar6 != '\0' & bVar18) == 1) && (otmp->oartifact != '\0' || spec_applies_ad_magm != '\0'))
  {
    pcVar12 = "!  A hail of magic missiles strikes";
    if (spec_applies_ad_magm == '\0') {
      pcVar12 = "";
    }
    uVar17 = 0x21;
    if (spec_applies_ad_magm == '\0') {
      uVar17 = 0x2e;
    }
    pline("The imaginary widget hits%s %s%c",pcVar12,local_338,uVar17);
    bVar24 = true;
  }
  bVar6 = attacks(0xc,otmp,olaunch,thrown);
  if ((dieroll < 9) && (bVar6 != '\0')) {
    bVar18 = otmp->spe;
    uVar8 = 4;
    if ('\x02' < (char)bVar18) {
      uVar8 = 4 >> (bVar18 / 3 & 0x1f);
    }
    bVar22 = spec_applies_ad_stun == '\0';
    iVar7 = (uint)bVar22 + dieroll;
    if ((char)bVar18 < '\x01') {
      bVar18 = 0;
    }
    uVar9 = mt_random();
    uVar9 = uVar9 % ((uint)!bVar22 * 4 + 7);
    uVar10 = mt_random();
    *dmgptr = (uVar10 & 3) + *dmgptr + 1;
    bVar22 = bVar18 <= uVar9 && uVar9 != bVar18;
    if (bVar22) {
      uVar9 = mt_random();
      *dmgptr = (uVar9 & 3) + *dmgptr + 1;
    }
    local_468 = (char *)(ulong)bVar22;
    if (iVar7 <= (int)uVar8) {
      uVar9 = mt_random();
      *dmgptr = (uVar9 & 3) + *dmgptr + 1;
      local_468 = (char *)0x2;
    }
    if (iVar7 <= (int)(uVar8 >> 1)) {
      uVar8 = mt_random();
      *dmgptr = (uVar8 & 3) + *dmgptr + 1;
      local_468 = (char *)0x3;
    }
    uVar8 = 0;
    if (((u.uprops[0x23].intrinsic != 0) && (uVar8 = 0, u.uprops[0x24].extrinsic == 0)) &&
       (uVar8 = 1, u.umonnum != u.umonster)) {
      bVar6 = dmgtype(youmonst.data,0x24);
      uVar8 = (uint)(bVar6 == '\0');
    }
    if ((byte)(mdef == &youmonst | bVar16 | magr == &youmonst) != 1) {
      bVar6 = (*(code *)(&DAT_0029c970 + *(int *)(&DAT_0029c970 + (long)local_468 * 4)))();
      return bVar6;
    }
    pcVar20 = vtense((char *)0x0,
                     *(char **)((long)mb_verb[0] + (long)local_468 * 8 + (ulong)(uVar8 << 5)));
    pline("The magic-absorbing blade %s %s!",pcVar20,local_338);
    bVar6 = (*(code *)(&DAT_0029c960 + *(int *)(&DAT_0029c960 + (long)local_468 * 4)))();
    return bVar6;
  }
  cVar1 = otmp->oartifact;
  if ((((long)cVar1 != 4 || mdef != &youmonst) && (spec_dbon_applies == 0)) &&
     ((spec_applies_ad_drli == '\0' && (spec_applies_spfx_behead == '\0')))) {
    return bVar24;
  }
  if ((spec_applies_ad_drli != '\0') &&
     (((artilist != (artifact *)0x0 && (cVar1 != '\0' && otmp != (obj *)0x0) &&
       ((artilist[cVar1].spfx & 0x100) != 0)) ||
      (bVar6 = oprop_attack(4,otmp,olaunch,thrown), bVar6 != '\0')))) {
    iVar7 = u.uhpmax;
    if ((magr == &youmonst || magr == (monst *)0x0) ||
       (bVar19 = true, (viz_array[magr->my][magr->mx] & 2U) == 0)) {
      if (mdef == &youmonst) {
        if (magr == &youmonst) goto LAB_0014e44c;
LAB_0014e487:
        bVar19 = false;
      }
      else {
        bVar19 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
        if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) {
LAB_0014e44c:
          bVar19 = false;
          if ((((u._1052_1_ & 1) != 0) && (bVar19 = false, u.ustuck == mdef)) &&
             ((u.uprops[0x1e].intrinsic != 0 ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (bVar19 = true, ((youmonst.data)->mflags1 & 0x1000) != 0)))))) {
            if (ublindf == (obj *)0x0) goto LAB_0014e487;
            bVar19 = ublindf->oartifact == '\x1d';
          }
        }
      }
    }
    if (mdef == &youmonst) {
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        if (cVar1 == '\x03') {
          pcVar12 = hcolor("black");
          pcVar13 = "The %s blade drains your life!";
          goto LAB_0014e613;
        }
        pcVar12 = distant_name(otmp,xname);
        pcVar12 = The(pcVar12);
        pline("%s drains your life!",pcVar12);
        oprop_id(4,otmp,ostack,olaunch);
      }
      else {
        pcVar12 = "object";
        if (cVar1 == '\x03') {
          pcVar12 = "unholy blade";
        }
        pcVar13 = "You feel an %s drain your life!";
LAB_0014e613:
        pline(pcVar13,pcVar12);
      }
      losexp("life drainage");
      bVar19 = true;
      if (magr != (monst *)0x0) {
        iVar2 = magr->mhpmax;
        if (magr->mhp < iVar2) {
          iVar7 = (iVar7 - u.uhpmax) / 2 + magr->mhp;
          if (iVar2 <= iVar7) {
            iVar7 = iVar2;
          }
          magr->mhp = iVar7;
        }
      }
    }
    else {
      if (bVar19 != false) {
        if (cVar1 == '\x03') {
          pcVar12 = hcolor("black");
          pcVar13 = mon_nam(mdef);
          pline("The %s blade draws the life from %s!",pcVar12,pcVar13);
        }
        else {
          pcVar12 = distant_name(otmp,xname);
          pcVar12 = The(pcVar12);
          pcVar13 = mon_nam(mdef);
          pline("%s draws the life from %s!",pcVar12,pcVar13);
          oprop_id(4,otmp,ostack,olaunch);
        }
      }
      if (mdef->m_lev == '\0') {
        *dmgptr = mdef->mhp * 2 + 200;
      }
      else {
        uVar8 = mt_random();
        uVar9 = (uVar8 & 7) + 1;
        *dmgptr = *dmgptr + uVar9;
        mdef->mhpmax = mdef->mhpmax - uVar9;
        mdef->m_lev = mdef->m_lev + 0xff;
        if ((uVar8 & 7) != 0) {
          healup(uVar9 >> 1,0,'\0','\0');
        }
      }
    }
    bVar24 = bVar19 != false || bVar24 != false;
  }
  if (spec_applies_spfx_behead == '\0') goto LAB_0014ee4e;
  if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
    paVar14 = (artifact *)0x0;
  }
  else {
    paVar14 = artilist + otmp->oartifact;
  }
  if (((paVar14 == (artifact *)0x0) || ((paVar14->spfx & 0x400) == 0)) &&
     (bVar6 = oprop_attack(8,otmp,olaunch,thrown), bVar6 == '\0')) goto LAB_0014ee4e;
  if (((magr != (monst *)0x0) == bVar22) ||
     (bVar19 = true, (viz_array[magr->my][magr->mx] & 2U) == 0)) {
    if (mdef == &youmonst) {
      if (magr == &youmonst) goto LAB_0014e776;
LAB_0014e7b1:
      bVar19 = false;
    }
    else {
      bVar19 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
      if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) {
LAB_0014e776:
        bVar19 = false;
        if ((((u._1052_1_ & 1) != 0) && (u.ustuck == mdef)) &&
           ((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (bVar19 = true, ((youmonst.data)->mflags1 & 0x1000) != 0)))))) {
          if (ublindf == (obj *)0x0) goto LAB_0014e7b1;
          bVar19 = ublindf->oartifact == '\x1d';
        }
      }
    }
  }
  pcVar12 = distant_name(otmp,xname);
  local_470 = local_138;
  snprintf(local_470,0x100,"%s %s",pcVar20,pcVar12);
  if (mdef == &youmonst) {
    pcVar20 = "you";
  }
  else {
    pcVar20 = mon_nam(mdef);
  }
  strcpy(local_438,pcVar20);
  if ((byte)(otmp->oclass | 4U) == 6) {
    if (((*(ushort *)&objects[otmp->otyp].field_0x11 & 1) == 0) ||
       (cVar1 = otmp->oartifact, dieroll != 1 || cVar1 == '\x04')) {
      if ((*(ushort *)&objects[otmp->otyp].field_0x11 & 1) == 0) goto LAB_0014e8d2;
      goto LAB_0014e8e6;
    }
    pcVar20 = local_138;
    if (cVar1 == '!') {
      pcVar20 = "The razor-sharp blade";
    }
    if (cVar1 == '\0') {
      oprop_id(8,otmp,ostack,olaunch);
    }
    if (((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) && (u.ustuck == mdef)) {
      pcVar20 = mon_nam(mdef);
      pline("You slice %s wide open!",pcVar20);
      *dmgptr = mdef->mhp * 2 + 200;
LAB_0014ed5f:
      bVar5 = true;
      bVar21 = true;
      goto LAB_0014ee30;
    }
    if (mdef == &youmonst) {
      if (2 < (youmonst.data)->msize) {
        if (magr != (monst *)0x0) {
          pcVar20 = Monnam(magr);
        }
        pcVar12 = "%s cuts deeply into you!";
LAB_0014ecd4:
        pline(pcVar12,pcVar20);
LAB_0014ecdb:
        *dmgptr = *dmgptr << 1;
        goto LAB_0014ed5f;
      }
      piVar15 = &u.mh;
      if (u.umonnum == u.umonster) {
        piVar15 = &u.uhp;
      }
      *dmgptr = *piVar15 * 2 + 200;
      pline("%s cuts you in half!",pcVar20);
    }
    else {
      if (notonhead != '\0') {
        bVar5 = true;
        bVar21 = false;
        goto LAB_0014ee30;
      }
      if (2 < mdef->data->msize) {
        if (magr == &youmonst) {
          pcVar20 = mon_nam(mdef);
          pcVar12 = "You slice deeply into %s!";
          goto LAB_0014ecd4;
        }
        if (bVar19 != false) {
          pcVar20 = Monnam(magr);
          pline("%s cuts deeply into %s!",pcVar20,local_438);
        }
        goto LAB_0014ecdb;
      }
      *dmgptr = mdef->mhp * 2 + 200;
      pcVar12 = mon_nam(mdef);
      pline("%s cuts %s in half!",pcVar20,pcVar12);
    }
    bVar5 = false;
    bVar21 = true;
    if (otmp->oartifact == '\0') goto LAB_0014ee30;
LAB_0014ee29:
    otmp->field_0x4a = otmp->field_0x4a | 0x20;
    bVar5 = false;
    bVar21 = true;
  }
  else {
LAB_0014e8d2:
    if ((dieroll == 1) || (mdef->data->mlet == '$')) {
LAB_0014e903:
      if (((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) && (u.ustuck == mdef)) {
        bVar21 = false;
        bVar5 = true;
      }
      else {
        bVar18 = otmp->oartifact;
        if ((bVar18 | 0x10) == 0x14) {
          local_470 = artilist[(char)bVar18].name;
        }
        if (bVar18 == 0) {
          oprop_id(8,otmp,ostack,olaunch);
        }
        if (mdef == &youmonst) {
          if (-1 < (short)(youmonst.data)->mflags1) {
            if ((((youmonst.data)->mflags1 & 4) != 0) || ((youmonst.data)->mlet == '6')) {
              pcVar20 = body_part(0xb);
              pline("%s slices through your %s.",local_470,pcVar20);
              goto LAB_0014ed1d;
            }
            piVar15 = &u.mh;
            if (u.umonnum == u.umonster) {
              piVar15 = &u.uhp;
            }
            *dmgptr = *piVar15 * 2 + 200;
            uVar8 = mt_random();
            pcVar20 = *(char **)(artifact_hit_behead_behead_msg + (ulong)(uVar8 & 1) * 8);
            pcVar12 = "you";
            goto LAB_0014eaf7;
          }
          if (bVar24 == false) {
            if (magr != (monst *)0x0) {
              local_470 = mon_nam(magr);
            }
            pline("Somehow, %s misses you wildly.",local_470);
            *dmgptr = 0;
            goto LAB_0014ed5f;
          }
LAB_0014eb20:
          bVar21 = false;
LAB_0014ed22:
          bVar5 = true;
        }
        else {
          uVar8 = mdef->data->mflags1;
          if ((((short)uVar8 < 0) || (notonhead != '\0')) || ((u._1052_1_ & 1) != 0)) {
            bVar5 = true;
            if (bVar24 != false) goto LAB_0014eb20;
            bVar21 = bVar19;
            if (magr == &youmonst || bVar19 != false) {
              pcVar20 = "Somehow, %s misses wildly.";
              mtmp = magr;
              if (magr == &youmonst) {
                pcVar20 = "Somehow, you miss %s wildly.";
                mtmp = mdef;
              }
              bVar21 = (bool)(magr == &youmonst | bVar19);
              pcVar12 = mon_nam(mtmp);
              pline(pcVar20,pcVar12);
            }
            *dmgptr = 0;
          }
          else {
            if (((uVar8 & 4) != 0) || (mdef->data->mlet == '6')) {
              pcVar20 = mon_nam(mdef);
              pcVar20 = s_suffix(pcVar20);
              pcVar12 = mbodypart(mdef,0xb);
              pline("%s slices through %s %s.",local_470,pcVar20,pcVar12);
LAB_0014ed1d:
              bVar21 = true;
              goto LAB_0014ed22;
            }
            *dmgptr = mdef->mhp * 2 + 200;
            uVar8 = mt_random();
            pcVar20 = *(char **)(artifact_hit_behead_behead_msg + (ulong)(uVar8 & 1) * 8);
            pcVar12 = mon_nam(mdef);
LAB_0014eaf7:
            bVar5 = false;
            pline(pcVar20,local_470,pcVar12);
            bVar21 = true;
            if (otmp->oartifact != '\0') goto LAB_0014ee29;
          }
        }
      }
    }
    else {
LAB_0014e8e6:
      bVar5 = true;
      bVar21 = false;
      if ((dieroll < 3) && (bVar21 = false, otmp->oartifact == '\x04')) goto LAB_0014e903;
    }
  }
LAB_0014ee30:
  bVar24 = (bool)(bVar24 != false | bVar21);
  if (!bVar5) {
    return bVar24;
  }
LAB_0014ee4e:
  if ((((byte)otmp->oartifact < 0x14) && ((0xce110U >> ((byte)otmp->oartifact & 0x1f) & 1) != 0)) &&
     ((dieroll < 4 && ((*(uint *)&mdef->field_0x60 & 0x100) == 0)))) {
    if (bVar3 && bVar4 || (bVar23 || bVar16 != false)) {
      pcVar20 = distant_name(otmp,xname);
      pcVar20 = The(pcVar20);
      if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
         && (((youmonst.data)->mflags1 & 0x1000) == 0)) {
        pcVar12 = "shines brilliantly";
      }
      else if (ublindf == (obj *)0x0) {
        pcVar12 = "roars deafeningly";
      }
      else {
        pcVar12 = "roars deafeningly";
        if (ublindf->oartifact == '\x1d') {
          pcVar12 = "shines brilliantly";
        }
      }
      pline("%s %s as it strikes %s!",pcVar20,pcVar12,local_338);
    }
    cancel_monst(mdef,otmp,bVar22,'\x01',magr == mdef);
    bVar24 = true;
  }
  return bVar24;
}

Assistant:

boolean artifact_hit(
    struct monst *magr,
    struct monst *mdef,
    struct obj *otmp,
    struct obj *ostack,
    boolean thrown,
    int *dmgptr,
    int dieroll /* needed for Magicbane and vorpal blades */
    )
{
	boolean youattack = (magr == &youmonst);
	boolean youdefend = (mdef == &youmonst);
	boolean vis = (!youattack && magr && cansee(magr->mx, magr->my))
	    || (!youdefend && cansee(mdef->mx, mdef->my))
	    || (youattack && u.uswallow && mdef == u.ustuck && !Blind);
	boolean realizes_damage;
	boolean msg_printed = FALSE;
	const char *wepdesc;
	char hittee[BUFSZ];
	char wepbuf[BUFSZ];
	struct obj *olaunch = NULL;

	if (thrown) {
	    /* Launcher properties stack with fired ammunition,
	     * so get the launcher here if that's the case. */
	    if (youattack)
		olaunch = uwep;
	    else if (magr)
		olaunch = MON_WEP(magr);

	    if (olaunch && (!is_launcher(olaunch) ||
			    !ammo_and_launcher(otmp, olaunch)))
		olaunch = NULL;
	}

	/* Exit early if not an artifact or absent of attack properties. */
	if (!otmp->oartifact &&
	    !oprop_attack(ITEM_FIRE|ITEM_FROST|ITEM_DRLI|ITEM_VORPAL,
			  otmp, olaunch, thrown))
	    return FALSE;

	snprintf(wepbuf, BUFSZ, "%s %s", youattack ? "Your" : "The",
					 distant_name(otmp, xname));
	wepdesc = wepbuf;

	strcpy(hittee, youdefend ? "you" : mon_nam(mdef));

	/* The following takes care of most of the damage, but not all--
	 * the exception being for level draining, which is specially
	 * handled.  Messages are done in this function, however.
	 */
	*dmgptr += spec_dbon(otmp, olaunch, thrown, mdef, *dmgptr);

	if (youattack && youdefend) {
	    warning("attacking yourself with weapon?");
	    return FALSE;
	}

	realizes_damage = (youdefend || vis || 
			   /* feel the effect even if not seen */
			   (youattack && mdef == u.ustuck));

	/* the four basic attacks: fire, cold, shock and missiles */
	if (attacks(AD_FIRE, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_fire)) {
		if (otmp->oartifact == ART_FIRE_BRAND)
		    wepdesc = "The fiery blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_fire ? "hits" :
			(mdef->data == &mons[PM_WATER_ELEMENTAL]) ?
			"vaporizes part of" : "burns",
			hittee, !spec_applies_ad_fire ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_fire)
		    oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, SCROLL_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(7)) {
		if (destroy_mitem(mdef, SPBOOK_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (youdefend && Slimed) {
		burn_away_slime();
		oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	}

	if (attacks(AD_COLD, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_cold)) {
		if (otmp->oartifact == ART_FROST_BRAND)
		    wepdesc = "The ice-cold blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_cold ? "hits" : "freezes",
			hittee, !spec_applies_ad_cold ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_cold)
		    oprop_id(ITEM_FROST, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_COLD, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FROST, otmp, ostack, olaunch);
		}
	    }
	}

	if (attacks(AD_ELEC, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_elec)) {
		pline("The massive hammer hits%s %s%c",
			  !spec_applies_ad_elec ? "" : "!  Lightning strikes",
			  hittee, !spec_applies_ad_elec ? '.' : '!');
		msg_printed = TRUE;
	    }
	    if (!rn2(5)) destroy_mitem(mdef, WAND_CLASS, AD_ELEC, dmgptr);
	}

	if (attacks(AD_MAGM, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_magm)) {
		pline("The imaginary widget hits%s %s%c",
			  !spec_applies_ad_magm ? "" :
				"!  A hail of magic missiles strikes",
			  hittee, !spec_applies_ad_magm ? '.' : '!');
		msg_printed = TRUE;
	    }
	}

	if (attacks(AD_STUN, otmp, olaunch, thrown) && dieroll <= MB_MAX_DIEROLL) {
	    /* Magicbane's special attacks (possibly modifies hittee[]) */
	    msg_printed = magicbane_hit(magr, mdef, otmp, dmgptr, dieroll, vis,
					hittee) || msg_printed;
	}

	if (otmp->oartifact != ART_THIEFBANE || !youdefend) {
	    if (!spec_dbon_applies &&
		!spec_applies_ad_drli && !spec_applies_spfx_behead) {
		/* since damage bonus didn't apply, nothing more to do;
		   no further attacks have side-effects on inventory */
		return msg_printed;
	    }
	}

	/* Stormbringer or thirsty weapon */
	if (spec_applies_ad_drli &&
	    (spec_ability(otmp, SPFX_DRLI) ||
	     oprop_attack(ITEM_DRLI, otmp, olaunch, thrown))) {
	    msg_printed = artifact_hit_drainlife(magr, mdef, otmp, ostack, olaunch,
						 dmgptr) || msg_printed;
	}

	/* Thiefbane, Tsurugi of Muramasa, Vorpal Blade or vorpal weapon */
	if (spec_applies_spfx_behead &&
	    (spec_ability(otmp, SPFX_BEHEAD) ||
	     oprop_attack(ITEM_VORPAL, otmp, olaunch, thrown))) {
	    boolean beheaded;
	    msg_printed = artifact_hit_behead(magr, mdef, otmp, ostack, olaunch,
					      dmgptr, dieroll, msg_printed,
					      &beheaded) || msg_printed;
	    /* No further effects if the monster was instakilled. */
	    if (beheaded)
		return msg_printed;
	}

	/* WAC -- 1/6 chance of cancellation with foobane weapons */
	if (otmp->oartifact == ART_ORCRIST ||
	    otmp->oartifact == ART_DRAGONBANE ||
	    otmp->oartifact == ART_DEMONBANE ||
	    otmp->oartifact == ART_WEREBANE ||
	    otmp->oartifact == ART_TROLLSBANE ||
	    otmp->oartifact == ART_THIEFBANE ||
	    otmp->oartifact == ART_OGRESMASHER) {
		if (!mdef->mcan && dieroll < 4) {
		    if (realizes_damage) {
			pline("%s %s as it strikes %s!",
			      The(distant_name(otmp, xname)),
			      Blind ? "roars deafeningly" : "shines brilliantly",
			      hittee);
		    }
		    cancel_monst(mdef, otmp, youattack, TRUE, magr == mdef);
		    msg_printed = TRUE;
		}
	}

	return msg_printed;
}